

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlat<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::GreaterThanEquals,true,false>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  uhugeint_t *ldata;
  unsigned_long *puVar1;
  uhugeint_t *rdata;
  sel_t *psVar2;
  sel_t *psVar3;
  idx_t iVar4;
  sel_t sVar5;
  
  ldata = (uhugeint_t *)left->data;
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  rdata = (uhugeint_t *)right->data;
  if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
    FlatVector::VerifyFlatVector(right);
    iVar4 = SelectFlatLoopSwitch<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::GreaterThanEquals,true,false>
                      (ldata,rdata,sel,count,&right->validity,true_sel,false_sel);
  }
  else {
    if (count != 0 && false_sel != (SelectionVector *)0x0) {
      psVar2 = sel->sel_vector;
      psVar3 = false_sel->sel_vector;
      iVar4 = 0;
      do {
        sVar5 = (sel_t)iVar4;
        if (psVar2 != (sel_t *)0x0) {
          sVar5 = psVar2[iVar4];
        }
        psVar3[iVar4] = sVar5;
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static idx_t SelectFlat(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                        SelectionVector *true_sel, SelectionVector *false_sel) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if (LEFT_CONSTANT && ConstantVector::IsNull(left)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		}
		if (RIGHT_CONSTANT && ConstantVector::IsNull(right)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		}

		if (LEFT_CONSTANT) {
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, FlatVector::Validity(right), true_sel, false_sel);
		} else if (RIGHT_CONSTANT) {
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, FlatVector::Validity(left), true_sel, false_sel);
		} else {
			ValidityMask combined_mask = FlatVector::Validity(left);
			combined_mask.Combine(FlatVector::Validity(right), count);
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, combined_mask, true_sel, false_sel);
		}
	}